

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall Builder::AddTarget(Builder *this,Node *node,string *err)

{
  bool bVar1;
  
  bVar1 = DependencyScan::RecomputeDirty(&this->scan_,node,err);
  if (bVar1) {
    if ((node->in_edge_ == (Edge *)0x0) || (bVar1 = true, node->in_edge_->outputs_ready_ == false))
    {
      bVar1 = Plan::AddTarget(&this->plan_,node,err);
      return bVar1;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Builder::AddTarget(Node* node, string* err) {
  if (!scan_.RecomputeDirty(node, err))
    return false;

  if (Edge* in_edge = node->in_edge()) {
    if (in_edge->outputs_ready())
      return true;  // Nothing to do.
  }

  if (!plan_.AddTarget(node, err))
    return false;

  return true;
}